

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yv12extend.c
# Opt level: O1

void extend_plane_high(uint8_t *src8,int src_stride,int width,int height,int extend_top,
                      int extend_left,int extend_bottom,int extend_right,int v_start,int v_end)

{
  void *__src;
  undefined2 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  long lVar16;
  long lVar17;
  long lVar18;
  undefined2 *puVar19;
  undefined2 *puVar20;
  long lVar21;
  ulong uVar22;
  undefined2 *puVar23;
  void *pvVar24;
  undefined2 *puVar25;
  undefined1 auVar26 [16];
  int iVar28;
  undefined1 auVar27 [16];
  int iVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  int iVar43;
  int iVar57;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  int iVar62;
  int iVar66;
  undefined1 in_XMM12 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar67 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar68 [16];
  
  auVar15 = _DAT_004d3310;
  auVar14 = _DAT_004d3300;
  auVar13 = _DAT_004d1710;
  auVar12 = _DAT_004d1700;
  auVar11 = _DAT_004d16f0;
  lVar10 = (long)src8 * 2;
  lVar17 = (long)extend_left;
  lVar18 = (long)src_stride;
  if (v_start < v_end) {
    puVar20 = (undefined2 *)(lVar10 + (long)(v_start * src_stride) * 2);
    puVar23 = puVar20 + -lVar17;
    puVar19 = puVar20 + width;
    puVar25 = puVar20 + (long)width + -1;
    lVar21 = lVar17 + -1;
    auVar26._8_4_ = (int)lVar21;
    auVar26._0_8_ = lVar21;
    auVar26._12_4_ = (int)((ulong)lVar21 >> 0x20);
    lVar21 = (long)extend_right + -1;
    auVar27._8_4_ = (int)lVar21;
    auVar27._0_8_ = lVar21;
    auVar27._12_4_ = (int)((ulong)lVar21 >> 0x20);
    auVar27 = auVar27 ^ _DAT_004d1710;
    do {
      if (extend_left != 0) {
        uVar1 = *puVar20;
        uVar22 = 0;
        do {
          auVar35._8_4_ = (int)uVar22;
          auVar35._0_8_ = uVar22;
          auVar35._12_4_ = (int)(uVar22 >> 0x20);
          auVar33 = auVar26 ^ auVar13;
          auVar44 = (auVar35 | auVar12) ^ auVar13;
          iVar43 = auVar33._0_4_;
          iVar62 = -(uint)(iVar43 < auVar44._0_4_);
          iVar28 = auVar33._4_4_;
          auVar45._4_4_ = -(uint)(iVar28 < auVar44._4_4_);
          iVar57 = auVar33._8_4_;
          iVar66 = -(uint)(iVar57 < auVar44._8_4_);
          iVar29 = auVar33._12_4_;
          auVar45._12_4_ = -(uint)(iVar29 < auVar44._12_4_);
          auVar54._4_4_ = iVar62;
          auVar54._0_4_ = iVar62;
          auVar54._8_4_ = iVar66;
          auVar54._12_4_ = iVar66;
          auVar67 = pshuflw(in_XMM13,auVar54,0xe8);
          auVar47._4_4_ = -(uint)(auVar44._4_4_ == iVar28);
          auVar47._12_4_ = -(uint)(auVar44._12_4_ == iVar29);
          auVar47._0_4_ = auVar47._4_4_;
          auVar47._8_4_ = auVar47._12_4_;
          auVar68 = pshuflw(in_XMM14,auVar47,0xe8);
          auVar45._0_4_ = auVar45._4_4_;
          auVar45._8_4_ = auVar45._12_4_;
          auVar44 = pshuflw(auVar67,auVar45,0xe8);
          auVar33._8_4_ = 0xffffffff;
          auVar33._0_8_ = 0xffffffffffffffff;
          auVar33._12_4_ = 0xffffffff;
          auVar33 = (auVar44 | auVar68 & auVar67) ^ auVar33;
          auVar33 = packssdw(auVar33,auVar33);
          if ((auVar33 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            puVar23[uVar22] = uVar1;
          }
          auVar45 = auVar47 & auVar54 | auVar45;
          auVar33 = packssdw(auVar45,auVar45);
          auVar44._8_4_ = 0xffffffff;
          auVar44._0_8_ = 0xffffffffffffffff;
          auVar44._12_4_ = 0xffffffff;
          auVar33 = packssdw(auVar33 ^ auVar44,auVar33 ^ auVar44);
          if ((auVar33._0_4_ >> 0x10 & 1) != 0) {
            puVar23[uVar22 + 1] = uVar1;
          }
          auVar33 = (auVar35 | auVar11) ^ auVar13;
          iVar62 = -(uint)(iVar43 < auVar33._0_4_);
          auVar63._4_4_ = -(uint)(iVar28 < auVar33._4_4_);
          iVar66 = -(uint)(iVar57 < auVar33._8_4_);
          auVar63._12_4_ = -(uint)(iVar29 < auVar33._12_4_);
          auVar46._4_4_ = iVar62;
          auVar46._0_4_ = iVar62;
          auVar46._8_4_ = iVar66;
          auVar46._12_4_ = iVar66;
          auVar58._4_4_ = -(uint)(auVar33._4_4_ == iVar28);
          auVar58._12_4_ = -(uint)(auVar33._12_4_ == iVar29);
          auVar58._0_4_ = auVar58._4_4_;
          auVar58._8_4_ = auVar58._12_4_;
          auVar63._0_4_ = auVar63._4_4_;
          auVar63._8_4_ = auVar63._12_4_;
          auVar33 = auVar58 & auVar46 | auVar63;
          auVar33 = packssdw(auVar33,auVar33);
          auVar2._8_4_ = 0xffffffff;
          auVar2._0_8_ = 0xffffffffffffffff;
          auVar2._12_4_ = 0xffffffff;
          auVar33 = packssdw(auVar33 ^ auVar2,auVar33 ^ auVar2);
          if ((auVar33 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            puVar23[uVar22 + 2] = uVar1;
          }
          auVar44 = pshufhw(auVar46,auVar46,0x84);
          auVar45 = pshufhw(auVar58,auVar58,0x84);
          auVar47 = pshufhw(auVar44,auVar63,0x84);
          auVar48._8_4_ = 0xffffffff;
          auVar48._0_8_ = 0xffffffffffffffff;
          auVar48._12_4_ = 0xffffffff;
          auVar48 = (auVar47 | auVar45 & auVar44) ^ auVar48;
          auVar44 = packssdw(auVar48,auVar48);
          if ((auVar44 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            puVar23[uVar22 + 3] = uVar1;
          }
          auVar44 = (auVar35 | auVar15) ^ auVar13;
          iVar62 = -(uint)(iVar43 < auVar44._0_4_);
          auVar50._4_4_ = -(uint)(iVar28 < auVar44._4_4_);
          iVar66 = -(uint)(iVar57 < auVar44._8_4_);
          auVar50._12_4_ = -(uint)(iVar29 < auVar44._12_4_);
          auVar59._4_4_ = iVar62;
          auVar59._0_4_ = iVar62;
          auVar59._8_4_ = iVar66;
          auVar59._12_4_ = iVar66;
          auVar33 = pshuflw(auVar33,auVar59,0xe8);
          auVar49._4_4_ = -(uint)(auVar44._4_4_ == iVar28);
          auVar49._12_4_ = -(uint)(auVar44._12_4_ == iVar29);
          auVar49._0_4_ = auVar49._4_4_;
          auVar49._8_4_ = auVar49._12_4_;
          auVar44 = pshuflw(auVar68 & auVar67,auVar49,0xe8);
          in_XMM14 = auVar44 & auVar33;
          auVar50._0_4_ = auVar50._4_4_;
          auVar50._8_4_ = auVar50._12_4_;
          auVar33 = pshuflw(auVar33,auVar50,0xe8);
          auVar67._8_4_ = 0xffffffff;
          auVar67._0_8_ = 0xffffffffffffffff;
          auVar67._12_4_ = 0xffffffff;
          auVar67 = (auVar33 | in_XMM14) ^ auVar67;
          in_XMM13 = packssdw(auVar67,auVar67);
          if ((in_XMM13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            puVar23[uVar22 + 4] = uVar1;
          }
          auVar50 = auVar49 & auVar59 | auVar50;
          auVar33 = packssdw(auVar50,auVar50);
          auVar68._8_4_ = 0xffffffff;
          auVar68._0_8_ = 0xffffffffffffffff;
          auVar68._12_4_ = 0xffffffff;
          auVar33 = packssdw(auVar33 ^ auVar68,auVar33 ^ auVar68);
          if ((auVar33 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            puVar23[uVar22 + 5] = uVar1;
          }
          auVar33 = (auVar35 | auVar14) ^ auVar13;
          auVar60._0_4_ = -(uint)(iVar43 < auVar33._0_4_);
          auVar60._4_4_ = -(uint)(iVar28 < auVar33._4_4_);
          auVar60._8_4_ = -(uint)(iVar57 < auVar33._8_4_);
          auVar60._12_4_ = -(uint)(iVar29 < auVar33._12_4_);
          auVar51._4_4_ = auVar60._0_4_;
          auVar51._0_4_ = auVar60._0_4_;
          auVar51._8_4_ = auVar60._8_4_;
          auVar51._12_4_ = auVar60._8_4_;
          auVar30._4_4_ = -(uint)(auVar33._4_4_ == iVar28);
          auVar30._12_4_ = -(uint)(auVar33._12_4_ == iVar29);
          auVar30._0_4_ = auVar30._4_4_;
          auVar30._8_4_ = auVar30._12_4_;
          auVar34._4_4_ = auVar60._4_4_;
          auVar34._0_4_ = auVar60._4_4_;
          auVar34._8_4_ = auVar60._12_4_;
          auVar34._12_4_ = auVar60._12_4_;
          in_XMM12 = auVar30 & auVar51 | auVar34;
          auVar33 = packssdw(auVar60,in_XMM12);
          auVar3._8_4_ = 0xffffffff;
          auVar3._0_8_ = 0xffffffffffffffff;
          auVar3._12_4_ = 0xffffffff;
          auVar33 = packssdw(auVar33 ^ auVar3,auVar33 ^ auVar3);
          if ((auVar33 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            puVar23[uVar22 + 6] = uVar1;
          }
          auVar44 = pshufhw(auVar51,auVar51,0x84);
          auVar33 = pshufhw(auVar30,auVar30,0x84);
          auVar35 = pshufhw(auVar34,auVar34,0x84);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          auVar33 = packssdw(auVar33 & auVar44,(auVar35 | auVar33 & auVar44) ^ auVar4);
          if ((auVar33 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            puVar23[uVar22 + 7] = uVar1;
          }
          uVar22 = uVar22 + 8;
        } while ((lVar17 + 7U & 0xfffffffffffffff8) != uVar22);
      }
      if (extend_right != 0) {
        uVar1 = *puVar25;
        uVar22 = 0;
        do {
          auVar31._8_4_ = (int)uVar22;
          auVar31._0_8_ = uVar22;
          auVar31._12_4_ = (int)(uVar22 >> 0x20);
          auVar33 = (auVar31 | auVar12) ^ auVar13;
          iVar43 = auVar27._0_4_;
          iVar62 = -(uint)(iVar43 < auVar33._0_4_);
          iVar28 = auVar27._4_4_;
          auVar37._4_4_ = -(uint)(iVar28 < auVar33._4_4_);
          iVar57 = auVar27._8_4_;
          iVar66 = -(uint)(iVar57 < auVar33._8_4_);
          iVar29 = auVar27._12_4_;
          auVar37._12_4_ = -(uint)(iVar29 < auVar33._12_4_);
          auVar52._4_4_ = iVar62;
          auVar52._0_4_ = iVar62;
          auVar52._8_4_ = iVar66;
          auVar52._12_4_ = iVar66;
          auVar35 = pshuflw(in_XMM12,auVar52,0xe8);
          auVar36._4_4_ = -(uint)(auVar33._4_4_ == iVar28);
          auVar36._12_4_ = -(uint)(auVar33._12_4_ == iVar29);
          auVar36._0_4_ = auVar36._4_4_;
          auVar36._8_4_ = auVar36._12_4_;
          auVar44 = pshuflw(in_XMM13,auVar36,0xe8);
          auVar37._0_4_ = auVar37._4_4_;
          auVar37._8_4_ = auVar37._12_4_;
          auVar33 = pshuflw(auVar35,auVar37,0xe8);
          auVar64._8_4_ = 0xffffffff;
          auVar64._0_8_ = 0xffffffffffffffff;
          auVar64._12_4_ = 0xffffffff;
          auVar64 = (auVar33 | auVar44 & auVar35) ^ auVar64;
          auVar33 = packssdw(auVar64,auVar64);
          if ((auVar33 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            puVar19[uVar22] = uVar1;
          }
          auVar37 = auVar36 & auVar52 | auVar37;
          auVar33 = packssdw(auVar37,auVar37);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          auVar33 = packssdw(auVar33 ^ auVar5,auVar33 ^ auVar5);
          if ((auVar33._0_4_ >> 0x10 & 1) != 0) {
            puVar19[uVar22 + 1] = uVar1;
          }
          auVar33 = (auVar31 | auVar11) ^ auVar13;
          iVar62 = -(uint)(iVar43 < auVar33._0_4_);
          auVar61._4_4_ = -(uint)(iVar28 < auVar33._4_4_);
          iVar66 = -(uint)(iVar57 < auVar33._8_4_);
          auVar61._12_4_ = -(uint)(iVar29 < auVar33._12_4_);
          auVar38._4_4_ = iVar62;
          auVar38._0_4_ = iVar62;
          auVar38._8_4_ = iVar66;
          auVar38._12_4_ = iVar66;
          auVar53._4_4_ = -(uint)(auVar33._4_4_ == iVar28);
          auVar53._12_4_ = -(uint)(auVar33._12_4_ == iVar29);
          auVar53._0_4_ = auVar53._4_4_;
          auVar53._8_4_ = auVar53._12_4_;
          auVar61._0_4_ = auVar61._4_4_;
          auVar61._8_4_ = auVar61._12_4_;
          auVar33 = auVar53 & auVar38 | auVar61;
          auVar33 = packssdw(auVar33,auVar33);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar33 = packssdw(auVar33 ^ auVar6,auVar33 ^ auVar6);
          if ((auVar33 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            puVar19[uVar22 + 2] = uVar1;
          }
          auVar47 = pshufhw(auVar38,auVar38,0x84);
          auVar54 = pshufhw(auVar53,auVar53,0x84);
          auVar45 = pshufhw(auVar47,auVar61,0x84);
          auVar39._8_4_ = 0xffffffff;
          auVar39._0_8_ = 0xffffffffffffffff;
          auVar39._12_4_ = 0xffffffff;
          auVar39 = (auVar45 | auVar54 & auVar47) ^ auVar39;
          auVar47 = packssdw(auVar39,auVar39);
          if ((auVar47 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            puVar19[uVar22 + 3] = uVar1;
          }
          auVar47 = (auVar31 | auVar15) ^ auVar13;
          iVar62 = -(uint)(iVar43 < auVar47._0_4_);
          auVar41._4_4_ = -(uint)(iVar28 < auVar47._4_4_);
          iVar66 = -(uint)(iVar57 < auVar47._8_4_);
          auVar41._12_4_ = -(uint)(iVar29 < auVar47._12_4_);
          auVar55._4_4_ = iVar62;
          auVar55._0_4_ = iVar62;
          auVar55._8_4_ = iVar66;
          auVar55._12_4_ = iVar66;
          auVar33 = pshuflw(auVar33,auVar55,0xe8);
          auVar40._4_4_ = -(uint)(auVar47._4_4_ == iVar28);
          auVar40._12_4_ = -(uint)(auVar47._12_4_ == iVar29);
          auVar40._0_4_ = auVar40._4_4_;
          auVar40._8_4_ = auVar40._12_4_;
          auVar35 = pshuflw(auVar44 & auVar35,auVar40,0xe8);
          in_XMM13 = auVar35 & auVar33;
          auVar41._0_4_ = auVar41._4_4_;
          auVar41._8_4_ = auVar41._12_4_;
          auVar33 = pshuflw(auVar33,auVar41,0xe8);
          auVar65._8_4_ = 0xffffffff;
          auVar65._0_8_ = 0xffffffffffffffff;
          auVar65._12_4_ = 0xffffffff;
          auVar65 = (auVar33 | in_XMM13) ^ auVar65;
          in_XMM12 = packssdw(auVar65,auVar65);
          if ((in_XMM12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            puVar19[uVar22 + 4] = uVar1;
          }
          auVar41 = auVar40 & auVar55 | auVar41;
          auVar33 = packssdw(auVar41,auVar41);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          auVar33 = packssdw(auVar33 ^ auVar7,auVar33 ^ auVar7);
          if ((auVar33 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            puVar19[uVar22 + 5] = uVar1;
          }
          auVar33 = (auVar31 | auVar14) ^ auVar13;
          iVar43 = -(uint)(iVar43 < auVar33._0_4_);
          auVar56._4_4_ = -(uint)(iVar28 < auVar33._4_4_);
          iVar57 = -(uint)(iVar57 < auVar33._8_4_);
          auVar56._12_4_ = -(uint)(iVar29 < auVar33._12_4_);
          auVar42._4_4_ = iVar43;
          auVar42._0_4_ = iVar43;
          auVar42._8_4_ = iVar57;
          auVar42._12_4_ = iVar57;
          auVar32._4_4_ = -(uint)(auVar33._4_4_ == iVar28);
          auVar32._12_4_ = -(uint)(auVar33._12_4_ == iVar29);
          auVar32._0_4_ = auVar32._4_4_;
          auVar32._8_4_ = auVar32._12_4_;
          auVar56._0_4_ = auVar56._4_4_;
          auVar56._8_4_ = auVar56._12_4_;
          auVar33 = auVar32 & auVar42 | auVar56;
          auVar33 = packssdw(auVar33,auVar33);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          auVar33 = packssdw(auVar33 ^ auVar8,auVar33 ^ auVar8);
          if ((auVar33 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            puVar19[uVar22 + 6] = uVar1;
          }
          auVar35 = pshufhw(auVar42,auVar42,0x84);
          auVar33 = pshufhw(auVar32,auVar32,0x84);
          auVar44 = pshufhw(auVar35,auVar56,0x84);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          auVar33 = packssdw(auVar33 & auVar35,(auVar44 | auVar33 & auVar35) ^ auVar9);
          if ((auVar33 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            puVar19[uVar22 + 7] = uVar1;
          }
          uVar22 = uVar22 + 8;
        } while (((long)extend_right + 7U & 0xfffffffffffffff8) != uVar22);
      }
      puVar20 = puVar20 + lVar18;
      puVar25 = puVar25 + lVar18;
      v_start = v_start + 1;
      puVar23 = puVar23 + lVar18;
      puVar19 = puVar19 + lVar18;
    } while (v_start != v_end);
  }
  __src = (void *)(lVar10 + lVar17 * -2);
  lVar21 = (long)(extend_left + width + extend_right);
  if (0 < extend_top) {
    pvVar24 = (void *)((long)__src + (long)-(src_stride * extend_top) * 2);
    do {
      memcpy(pvVar24,__src,lVar21 * 2);
      pvVar24 = (void *)((long)pvVar24 + lVar18 * 2);
      extend_top = extend_top + -1;
    } while (extend_top != 0);
  }
  if (0 < extend_bottom) {
    lVar16 = (long)(src_stride * (height + -1));
    pvVar24 = (void *)(lVar10 + lVar16 * 2 + lVar18 * 2 + lVar17 * -2);
    do {
      memcpy(pvVar24,(void *)((long)__src + lVar16 * 2),lVar21 * 2);
      pvVar24 = (void *)((long)pvVar24 + lVar18 * 2);
      extend_bottom = extend_bottom + -1;
    } while (extend_bottom != 0);
  }
  return;
}

Assistant:

static void extend_plane_high(uint8_t *const src8, int src_stride, int width,
                              int height, int extend_top, int extend_left,
                              int extend_bottom, int extend_right, int v_start,
                              int v_end) {
  int i;
  const int linesize = extend_left + extend_right + width;
  assert(linesize <= src_stride);
  uint16_t *src = CONVERT_TO_SHORTPTR(src8);

  /* copy the left and right most columns out */
  uint16_t *src_ptr1 = src + v_start * src_stride;
  uint16_t *src_ptr2 = src + v_start * src_stride + width - 1;
  uint16_t *dst_ptr1 = src + v_start * src_stride - extend_left;
  uint16_t *dst_ptr2 = src_ptr2 + 1;

  for (i = v_start; i < v_end; ++i) {
    aom_memset16(dst_ptr1, src_ptr1[0], extend_left);
    aom_memset16(dst_ptr2, src_ptr2[0], extend_right);
    src_ptr1 += src_stride;
    src_ptr2 += src_stride;
    dst_ptr1 += src_stride;
    dst_ptr2 += src_stride;
  }

  /* Now copy the top and bottom lines into each line of the respective
   * borders
   */
  src_ptr1 = src - extend_left;
  dst_ptr1 = src_ptr1 + src_stride * -extend_top;

  for (i = 0; i < extend_top; ++i) {
    memcpy(dst_ptr1, src_ptr1, linesize * sizeof(uint16_t));
    dst_ptr1 += src_stride;
  }

  src_ptr2 = src_ptr1 + src_stride * (height - 1);
  dst_ptr2 = src_ptr2;

  for (i = 0; i < extend_bottom; ++i) {
    dst_ptr2 += src_stride;
    memcpy(dst_ptr2, src_ptr2, linesize * sizeof(uint16_t));
  }
}